

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt_limits.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  uchar *puVar4;
  uint *puVar5;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  long lVar6;
  char *pcVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  void *buf;
  byte bVar11;
  bool bVar12;
  size_t written;
  size_t psbt_len;
  undefined8 uStack_98;
  char *pcStack_90;
  undefined8 local_58;
  uchar *local_50;
  uchar *local_48;
  ulong local_40;
  ulong local_38;
  
  iVar3 = getpagesize();
  sVar9 = (size_t)iVar3;
  puVar4 = (uchar *)mmap((void *)0x0,sVar9 * 2,3,0x22,-1,0);
  if (puVar4 == (uchar *)0xffffffffffffffff) {
    puVar5 = (uint *)__errno_location();
    uVar1 = *puVar5;
    pcStack_90 = "Failed to mmap anon, errno %d";
  }
  else {
    local_48 = puVar4 + sVar9;
    iVar3 = munmap(local_48,sVar9);
    if (iVar3 == 0) {
      lVar6 = 0;
      do {
        test_psbt_read((psbt_test *)((long)&invalid_psbts[0].hex + lVar6),puVar4,sVar9);
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x1a0);
      lVar6 = 0;
      local_50 = puVar4;
      while( true ) {
        test_psbt_read(valid_psbts + lVar6,local_50,sVar9);
        pcVar7 = valid_psbts[lVar6].base64;
        iVar3 = wally_psbt_from_base64(pcVar7,&local_58);
        if (iVar3 != 0) break;
        iVar3 = wally_psbt_get_length(local_58,0,&local_38);
        if (iVar3 != 0) break;
        uVar10 = 0;
        puVar4 = local_48;
        do {
          iVar3 = wally_psbt_to_bytes(local_58,0,puVar4,uVar10,&local_40);
          if (iVar3 != 0) {
            fail("wally_psbt_to_bytes %s should have succeeded",pcVar7);
            local_40 = extraout_RDX;
LAB_0010236c:
            fail("wally_psbt_to_bytes %s wrote %zu in %zu bytes?",pcVar7,local_40,uVar10);
            goto LAB_00102380;
          }
          if (local_40 != local_38) goto LAB_0010236c;
          uVar10 = uVar10 + 1;
          puVar4 = puVar4 + -1;
        } while (uVar10 <= local_38);
        wally_psbt_free(local_58);
        lVar6 = lVar6 + 1;
        if (lVar6 == 10) {
          wally_cleanup(0);
          return 0;
        }
      }
LAB_00102380:
      abort();
    }
    puVar5 = (uint *)__errno_location();
    uVar1 = *puVar5;
    pcStack_90 = "Failed to munmap /dev/zero, errno %d";
  }
  uVar10 = (ulong)uVar1;
  fail(pcStack_90);
  sVar9 = strlen(*(char **)pcStack_90);
  if (extraout_RDX_00 < sVar9 >> 1) {
    __assert_fail("hex_data_size(strlen(test->hex)) <= plen",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/libwally-core/src/ctest/test_psbt_limits.c"
                  ,0x50,"void test_psbt_read(const struct psbt_test *, unsigned char *, size_t)");
  }
  lVar6 = uVar10 + extraout_RDX_00;
  pcVar7 = *(char **)pcStack_90;
  uVar10 = 0;
  do {
    buf = (void *)(lVar6 - uVar10);
    _Var2 = hex_decode(pcVar7,uVar10 * 2,buf,uVar10);
    if (!_Var2) {
      abort();
    }
    iVar3 = wally_psbt_from_bytes(buf,uVar10,&uStack_98);
    if (iVar3 == 0) {
      wally_psbt_free(uStack_98);
    }
    lVar8 = 0;
    do {
      bVar11 = (byte)(1 << ((byte)lVar8 & 0x1f));
      *(byte *)(lVar6 + -1) = *(byte *)(lVar6 + -1) ^ bVar11;
      iVar3 = wally_psbt_from_bytes(buf,uVar10,&uStack_98);
      if (iVar3 == 0) {
        wally_psbt_free(uStack_98);
      }
      *(byte *)(lVar6 + -1) = *(byte *)(lVar6 + -1) ^ bVar11;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    pcVar7 = *(char **)pcStack_90;
    sVar9 = strlen(pcVar7);
    bVar12 = uVar10 < sVar9 >> 1;
    uVar10 = uVar10 + 1;
  } while (bVar12);
  return (int)(sVar9 >> 1);
}

Assistant:

int main(void)
{
    size_t i;
    size_t plen;
    unsigned char *p = cliff(&plen);

    for (i = 0; i < sizeof(invalid_psbts) / sizeof(invalid_psbts[0]); i++) {
        test_psbt_read(invalid_psbts + i, p, plen);
    }

    for (i = 0; i < sizeof(valid_psbts) / sizeof(valid_psbts[0]); i++) {
        test_psbt_read(valid_psbts + i, p, plen);
        test_psbt_write(valid_psbts + i, p, plen);
    }

    wally_cleanup(0);
    return 0;
}